

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O3

int sort_5_4::select_sort(int *a,int n)

{
  int iVar1;
  bool bVar2;
  int i;
  ulong uVar3;
  
  _i = 1;
  do {
    iVar1 = a[_i];
    uVar3 = _i;
    do {
      if (a[uVar3 - 1 & 0xffffffff] <= iVar1) goto LAB_0010398b;
      a[uVar3] = a[uVar3 - 1 & 0xffffffff];
      bVar2 = 1 < (long)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar2);
    uVar3 = 0;
LAB_0010398b:
    a[(int)uVar3] = iVar1;
    _i = _i + 1;
  } while( true );
}

Assistant:

int insert_sort_1(int *a, int n) {
        int t, j;
        for (int i = 1; i < n; i++) {
            t = a[i];
            for (j = i - 1; j >= 0 && a[j] > t; j--)
                a[1 + j] = a[j];
            a[j + 1] = t;
        }
    }